

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

bool __thiscall State::moveLeft(State *this,State *s)

{
  int iVar1;
  int iVar2;
  int **ppiVar3;
  int *piVar4;
  State *this_00;
  
  iVar1 = (this->blank).width;
  if (iVar1 != 0) {
    operator=(s,this);
    iVar2 = (s->blank).width;
    (s->blank).width = iVar2 + -1;
    ppiVar3 = s->tiles;
    piVar4 = ppiVar3[(s->blank).height];
    piVar4[iVar2] = piVar4[(long)iVar2 + -1];
    ppiVar3[(s->blank).height][(s->blank).width] = 0;
    this_00 = (State *)operator_new(0x28);
    State(this_00,this);
    s->previous = this_00;
  }
  return iVar1 != 0;
}

Assistant:

bool State::moveLeft(State &s) {
    if (blank.width == 0) {
        return false;
    }

    s = *this;
    s.moveY(-1);
    s.previous = new State(*this);
    return true;
}